

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zCrcOpt.c
# Opt level: O0

UInt32 CrcUpdateT8(UInt32 v,void *data,size_t size,UInt32 *table)

{
  uint uVar1;
  uint uVar2;
  UInt32 d;
  Byte *p;
  UInt32 *table_local;
  size_t size_local;
  void *data_local;
  UInt32 v_local;
  
  p = (Byte *)data;
  v_local = v;
  for (size_local = size; size_local != 0 && ((ulong)p & 7) != 0; size_local = size_local - 1) {
    v_local = table[(v_local ^ *p) & 0xff] ^ v_local >> 8;
    p = p + 1;
  }
  for (; 7 < size_local; size_local = size_local - 8) {
    uVar2 = *(uint *)p ^ v_local;
    uVar1 = *(uint *)(p + 4);
    v_local = table[(uVar1 & 0xff) + 0x300] ^ table[(uVar1 >> 8 & 0xff) + 0x200] ^
              table[(uVar1 >> 0x10 & 0xff) + 0x100] ^ table[uVar1 >> 0x18] ^
              table[(uVar2 & 0xff) + 0x700] ^ table[(uVar2 >> 8 & 0xff) + 0x600] ^
              table[(uVar2 >> 0x10 & 0xff) + 0x500] ^ table[(uVar2 >> 0x18) + 0x400];
    p = p + 8;
  }
  for (; size_local != 0; size_local = size_local - 1) {
    v_local = table[(v_local ^ *p) & 0xff] ^ v_local >> 8;
    p = p + 1;
  }
  return v_local;
}

Assistant:

UInt32 MY_FAST_CALL CrcUpdateT8(UInt32 v, const void *data, size_t size, const UInt32 *table)
{
  const Byte *p = (const Byte *)data;
  for (; size > 0 && ((unsigned)(ptrdiff_t)p & 7) != 0; size--, p++)
    v = CRC_UPDATE_BYTE_2(v, *p);
  for (; size >= 8; size -= 8, p += 8)
  {
    UInt32 d;
    v ^= *(const UInt32 *)p;
    v =
          table[0x700 + ((v      ) & 0xFF)]
        ^ table[0x600 + ((v >>  8) & 0xFF)]
        ^ table[0x500 + ((v >> 16) & 0xFF)]
        ^ table[0x400 + ((v >> 24))];
    d = *((const UInt32 *)p + 1);
    v ^=
          table[0x300 + ((d      ) & 0xFF)]
        ^ table[0x200 + ((d >>  8) & 0xFF)]
        ^ table[0x100 + ((d >> 16) & 0xFF)]
        ^ table[0x000 + ((d >> 24))];
  }
  for (; size > 0; size--, p++)
    v = CRC_UPDATE_BYTE_2(v, *p);
  return v;
}